

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.h
# Opt level: O0

void __thiscall
jaegertracing::agent::thrift::AgentClient::AgentClient
          (AgentClient *this,shared_ptr<apache::thrift::protocol::TProtocol> *prot)

{
  shared_ptr<apache::thrift::protocol::TProtocol> local_28;
  shared_ptr<apache::thrift::protocol::TProtocol> *local_18;
  shared_ptr<apache::thrift::protocol::TProtocol> *prot_local;
  AgentClient *this_local;
  
  local_18 = prot;
  prot_local = (shared_ptr<apache::thrift::protocol::TProtocol> *)this;
  AgentIf::AgentIf((AgentIf *)this);
  *(undefined ***)this = &PTR__AgentClient_005175f8;
  *(undefined ***)this = &PTR__AgentClient_005175f8;
  std::shared_ptr<apache::thrift::protocol::TProtocol>::shared_ptr(&this->piprot_);
  std::shared_ptr<apache::thrift::protocol::TProtocol>::shared_ptr(&this->poprot_);
  std::shared_ptr<apache::thrift::protocol::TProtocol>::shared_ptr(&local_28,prot);
  setProtocol(this,&local_28);
  std::shared_ptr<apache::thrift::protocol::TProtocol>::~shared_ptr(&local_28);
  return;
}

Assistant:

AgentClient(std::shared_ptr< ::apache::thrift::protocol::TProtocol> prot) {
    setProtocol(prot);
  }